

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall CLPIParser::Extent_Start_Point(CLPIParser *this,uint8_t *buffer,uint dataLength)

{
  int iVar1;
  uint uVar2;
  reference pvVar3;
  int local_48;
  int i;
  int number_of_extent_start_points;
  BitStreamReader reader;
  uint dataLength_local;
  uint8_t *buffer_local;
  CLPIParser *this_local;
  
  reader.m_bitLeft = dataLength;
  BitStreamReader::BitStreamReader((BitStreamReader *)&i);
  BitStreamReader::setBuffer((BitStreamReader *)&i,buffer,buffer + reader.m_bitLeft);
  BitStreamReader::skipBits((BitStreamReader *)&i,0x20);
  BitStreamReader::skipBits((BitStreamReader *)&i,0x10);
  iVar1 = BitStreamReader::getBits<int>((BitStreamReader *)&i,0x10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->SPN_extent_start,(long)iVar1);
  for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
    uVar2 = BitStreamReader::getBits((BitStreamReader *)&i,0x20);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->SPN_extent_start,(long)local_48);
    *pvVar3 = uVar2;
  }
  return;
}

Assistant:

void CLPIParser::Extent_Start_Point(uint8_t* buffer, const unsigned dataLength)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + dataLength);
    reader.skipBits(32);  // length

    reader.skipBits(16);  // reserved_for_future_use
    const int number_of_extent_start_points = reader.getBits<int>(16);
    SPN_extent_start.resize(number_of_extent_start_points);
    for (int i = 0; i < number_of_extent_start_points; ++i)
    {
        SPN_extent_start[i] = reader.getBits(32);
    }
}